

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_array.h
# Opt level: O1

void __thiscall features::free_space_names(features *this,size_t i)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar1;
  ulong uVar2;
  
  psVar1 = (this->space_names)._begin;
  if (i < (ulong)((long)(this->space_names)._end - (long)psVar1 >> 4)) {
    uVar2 = i << 4 | 8;
    do {
      this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 ((long)&(psVar1->
                         super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr + uVar2);
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      i = i + 1;
      psVar1 = (this->space_names)._begin;
      uVar2 = uVar2 + 0x10;
    } while (i < (ulong)((long)(this->space_names)._end - (long)psVar1 >> 4));
  }
  return;
}

Assistant:

inline size_t size() const { return _end - _begin; }